

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_files.cpp
# Opt level: O1

int create_files(int argc,char **argv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *reqs_begin;
  pointer pcVar1;
  long *plVar2;
  ulong uVar3;
  undefined1 *puVar4;
  pointer pbVar5;
  pointer pbVar6;
  undefined8 uVar7;
  bool bVar8;
  ulong uVar9;
  Caller p_Var10;
  void *pvVar11;
  syscall_file *this;
  ulong *puVar12;
  ostream *poVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long lVar15;
  int iVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar17;
  ulong uVar18;
  element_type *peVar19;
  ulong uVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  disks_arr;
  size_t buffer_size;
  external_size_type length;
  stringstream ss;
  CmdlineParser cp;
  element_type *local_470;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_420;
  long local_418;
  undefined1 local_410 [64];
  undefined1 local_3d0 [16];
  size_type local_3c0;
  undefined8 auStack_3b0 [12];
  ios_base local_350 [264];
  undefined1 local_248 [384];
  CmdlineParser local_c8;
  
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tlx::CmdlineParser::CmdlineParser(&local_c8);
  puVar4 = local_3d0 + 0x10;
  local_3d0._0_8_ = puVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_410 + 0x40),"filesize","");
  pcVar1 = local_248 + 0x10;
  local_248._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"Number of bytes to write to files.","");
  tlx::CmdlineParser::add_param_bytes
            (&local_c8,(string *)(local_410 + 0x40),(uint64_t *)(local_410 + 0x20),
             (string *)local_248);
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((undefined1 *)local_3d0._0_8_ != puVar4) {
    operator_delete((void *)local_3d0._0_8_,local_3c0 + 1);
  }
  local_3d0._0_8_ = puVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_410 + 0x40),"filename","");
  local_248._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Paths to files to write.","")
  ;
  tlx::CmdlineParser::add_param_stringlist
            (&local_c8,(string *)(local_410 + 0x40),&local_438,(string *)local_248);
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((undefined1 *)local_3d0._0_8_ != puVar4) {
    operator_delete((void *)local_3d0._0_8_,local_3c0 + 1);
  }
  bVar8 = tlx::CmdlineParser::process(&local_c8,argc,argv);
  uVar7 = local_410._32_8_;
  iVar16 = -1;
  if (bVar8) {
    if (local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar9 = 0;
      lVar15 = 0;
    }
    else {
      lVar17 = 0;
      poVar13 = (ostream *)(local_410 + 0x40);
      uVar20 = 0;
      do {
        unlink(*(char **)((long)&((local_438.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar17));
        tlx::Logger::Logger((Logger *)poVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"# Add disk: ",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,*(char **)((long)&((local_438.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar17),
                   *(long *)((long)&(local_438.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            lVar17));
        tlx::Logger::~Logger((Logger *)poVar13);
        uVar20 = uVar20 + 1;
        lVar15 = (long)local_438.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_438.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = lVar15 >> 5;
        lVar17 = lVar17 + 0x20;
      } while (uVar20 < uVar9);
    }
    pbVar6 = local_438.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = local_438.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_410._24_8_ = (void *)0x10000000;
    p_Var10 = (Caller)foxxll::aligned_alloc<4096ul>(lVar15 << 0x17,0);
    pvVar11 = operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | lVar15 >> 2);
    uVar18 = lVar15 >> 4;
    uVar20 = 0xffffffffffffffff;
    if (uVar18 < 0x2000000000000000) {
      uVar20 = lVar15 >> 1 | 8;
    }
    local_410._40_8_ = operator_new__(uVar20);
    *(ulong *)local_410._40_8_ = uVar18;
    reqs_begin = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_410._40_8_ + 8);
    if (pbVar6 != pbVar5) {
      memset(reqs_begin,0,lVar15 >> 1 & 0xfffffffffffffff8);
    }
    if (lVar15 * 0x200000 != 0) {
      lVar17 = 0;
      do {
        *(int *)(p_Var10 + lVar17 * 4) = (int)lVar17;
        lVar17 = lVar17 + 1;
      } while (lVar15 * 0x200000 != lVar17);
    }
    if (uVar9 != 0) {
      lVar15 = 0;
      uVar20 = 0;
      do {
        this = (syscall_file *)operator_new(0x98);
        foxxll::syscall_file::syscall_file
                  (this,(string *)
                        ((long)&((local_438.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar15),0x1c,(int)uVar20,-1,0xffffffff,(file_stats *)0x0);
        *(undefined1 **)((long)pvVar11 + uVar20 * 8) = &(this->super_ufs_file_base).field_0x70;
        uVar20 = uVar20 + 1;
        lVar15 = lVar15 + 0x20;
      } while (uVar9 != uVar20);
    }
    if ((element_type *)uVar7 != (element_type *)0x0) {
      local_410._48_8_ = (long)reqs_begin + uVar18 * 8;
      local_470 = (element_type *)0x0;
      local_410._16_8_ = p_Var10;
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)(local_410 + 0x40));
        puVar12 = (ulong *)(local_410 + 0x18);
        if ((element_type *)local_410._32_8_ != (element_type *)0x0) {
          local_248._0_8_ = (pointer)(uVar7 - (long)local_470);
          if ((pointer)(uVar7 - (long)local_470) < (pointer)0x10000000) {
            puVar12 = (ulong *)local_248;
          }
        }
        uVar20 = *puVar12;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3d0 + 0x10),"Disk offset ",0xc);
        *(undefined8 *)((long)auStack_3b0 + *(long *)(local_3c0 - 0x18)) = 7;
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)(local_3d0 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," MiB: ",6);
        *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
             *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 4;
        lVar15 = std::chrono::_V2::steady_clock::now();
        local_410._56_8_ = (double)(lVar15 / 1000) / 1000000.0;
        if (uVar9 != 0) {
          uVar18 = 0;
          p_Var14 = reqs_begin;
          p_Var10 = (Caller)local_410._16_8_;
          do {
            lVar15 = 0;
            this_00 = p_Var14;
            peVar19 = local_470;
            do {
              plVar2 = *(long **)((long)pvVar11 + uVar18 * 8);
              local_248._16_8_ = 0;
              local_248._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_248._0_8_ = (pointer)0x0;
              local_248._8_8_ = 0;
              (**(code **)(*plVar2 + 8))
                        (&local_420,plVar2,p_Var10 + lVar15,peVar19,uVar20 >> 1,local_248);
              if (*(request **)this_00 != local_420.ptr_) {
                tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                          ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)this_00);
                *(request **)this_00 = local_420.ptr_;
                local_420.ptr_ = (request *)0x0;
              }
              tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                        (&local_420);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._24_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._24_8_);
              }
              this_00 = this_00 + 8;
              lVar15 = lVar15 + 0x8000000;
              peVar19 = (element_type *)((long)peVar19 + (uVar20 >> 1));
            } while (lVar15 == 0x8000000);
            uVar18 = uVar18 + 1;
            p_Var14 = p_Var14 + 0x10;
            p_Var10 = p_Var10 + 0x10000000;
          } while (uVar18 != uVar9);
        }
        foxxll::wait_all<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>*>
                  ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)reqs_begin,
                   (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_410._48_8_)
        ;
        lVar15 = std::chrono::_V2::steady_clock::now();
        *(undefined8 *)((long)auStack_3b0 + *(long *)(local_3c0 - 0x18)) = 7;
        poVar13 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)(local_3d0 + 0x10),
                             (int)(((((double)CONCAT44(0x45300000,(int)(uVar20 >> 0x20)) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0))
                                   * 9.5367431640625e-07) /
                                  ((double)(lVar15 / 1000) / 1000000.0 - (double)local_410._56_8_)))
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," MiB/s,",7);
        tlx::Logger::Logger((Logger *)local_248);
        p_Var10 = (Caller)local_410._16_8_;
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_248,(char *)local_420.ptr_,local_418);
        if (local_420.ptr_ != (request *)local_410) {
          operator_delete(local_420.ptr_,local_410._0_8_ + 1);
        }
        tlx::Logger::~Logger((Logger *)local_248);
        local_470 = (element_type *)((long)local_470 + uVar20);
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_410 + 0x40));
        std::ios_base::~ios_base(local_350);
      } while (local_470 < (ulong)uVar7);
    }
    uVar7 = local_410._40_8_;
    uVar20 = *(ulong *)local_410._40_8_ * 8;
    uVar18 = uVar20;
    uVar3 = *(ulong *)local_410._40_8_;
    while (uVar3 != 0) {
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)(uVar7 + uVar18));
      uVar18 = uVar18 - 8;
      uVar3 = uVar18;
    }
    operator_delete__((void *)uVar7,uVar20 + 8);
    if (uVar9 != 0) {
      uVar20 = 0;
      do {
        plVar2 = *(long **)((long)pvVar11 + uVar20 * 8);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 0x60))();
        }
        uVar20 = uVar20 + 1;
      } while (uVar9 != uVar20);
    }
    operator_delete__(pvVar11);
    if (p_Var10 != (Caller)0x0) {
      free(*(void **)(p_Var10 + -8));
    }
    iVar16 = 0;
  }
  tlx::CmdlineParser::~CmdlineParser(&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_438);
  return iVar16;
}

Assistant:

int create_files(int argc, char* argv[])
{
    std::vector<std::string> disks_arr;
    external_size_type offset = 0, length;

    tlx::CmdlineParser cp;
    cp.add_param_bytes(
        "filesize", length,
        "Number of bytes to write to files."
    );
    cp.add_param_stringlist(
        "filename", disks_arr,
        "Paths to files to write."
    );

    if (!cp.process(argc, argv))
        return -1;

    external_size_type endpos = offset + length;

    for (size_t i = 0; i < disks_arr.size(); ++i)
    {
        unlink(disks_arr[i].c_str());
        LOG1 << "# Add disk: " << disks_arr[i];
    }

    const size_t ndisks = disks_arr.size();

#if FOXXLL_WINDOWS
    size_t buffer_size = 64 * MB;
#else
    size_t buffer_size = 256 * MB;
#endif
    const size_t buffer_size_int = buffer_size / sizeof(int);

    unsigned chunks = 2;
    const size_t chunk_size = buffer_size / chunks;
    const size_t chunk_size_int = chunk_size / sizeof(int);

    size_t i = 0, j = 0;

    auto* buffer = static_cast<int*>(foxxll::aligned_alloc<BLOCK_ALIGN>(buffer_size * ndisks));
    file** disks = new file*[ndisks];
    request_ptr* reqs = new request_ptr[ndisks * chunks];
#ifdef WATCH_TIMES
    double* r_finish_times = new double[ndisks];
    double* w_finish_times = new double[ndisks];
#endif

    for (i = 0; i < ndisks * buffer_size_int; i++)
        buffer[i] = static_cast<int>(i);

    for (i = 0; i < ndisks; i++)
    {
#if FOXXLL_WINDOWS
 #ifdef RAW_ACCESS
        disks[i] = new foxxll::wincall_file(
                disks_arr[i],
                file::CREAT | file::RDWR | file::DIRECT, static_cast<int>(i)
            );
 #else
        disks[i] = new foxxll::wincall_file(
                disks_arr[i],
                file::CREAT | file::RDWR, static_cast<int>(i)
            );
 #endif
#else
 #ifdef RAW_ACCESS
        disks[i] = new foxxll::syscall_file(
                disks_arr[i],
                file::CREAT | file::RDWR | file::DIRECT, static_cast<int>(i)
            );
 #else
        disks[i] = new foxxll::syscall_file(
                disks_arr[i],
                file::CREAT | file::RDWR, static_cast<int>(i)
            );
 #endif
#endif
    }

    while (offset < endpos)
    {
        std::stringstream ss;

        const size_t current_block_size =
            length
            ? static_cast<size_t>(std::min<external_size_type>(buffer_size, endpos - offset))
            : buffer_size;

        const size_t current_chunk_size = current_block_size / chunks;

        ss << "Disk offset " << std::setw(7) << offset / MB << " MiB: " << std::fixed;

        double begin = timestamp(), end;

#ifndef DO_ONLY_READ
        for (i = 0; i < ndisks; i++)
        {
            for (j = 0; j < chunks; j++)
                reqs[i * chunks + j] =
                    disks[i]->awrite(
                        buffer + buffer_size_int * i + j * chunk_size_int,
                        offset + j * current_chunk_size,
                        current_chunk_size
                    );
        }

 #ifdef WATCH_TIMES
        watch_times(reqs, ndisks, w_finish_times);
 #else
        wait_all(reqs, ndisks * chunks);
 #endif

        end = timestamp();

 #ifdef WATCH_TIMES
        out_stat(begin, end, w_finish_times, ndisks, disks_arr);
 #endif
        ss << std::setw(7) << int(double(current_block_size) / MB / (end - begin)) << " MiB/s,";
#endif

#ifndef NOREAD
        begin = timestamp();

        for (i = 0; i < ndisks; i++)
        {
            for (j = 0; j < chunks; j++)
                reqs[i * chunks + j] = disks[i]->aread(
                        buffer + buffer_size_int * i + j * chunk_size_int,
                        offset + j * current_chunk_size,
                        current_chunk_size
                    );
        }

 #ifdef WATCH_TIMES
        watch_times(reqs, ndisks, r_finish_times);
 #else
        wait_all(reqs, ndisks * chunks);
 #endif

        end = timestamp();

        ss << int(double(current_block_size) / MB / (end - begin)) << " MiB/s";
        ss.str();

#ifdef WATCH_TIMES
        out_stat(begin, end, r_finish_times, ndisks, disks_arr);
#endif

        if (CHECK_AFTER_READ) {
            for (size_t i = 0; i < ndisks * buffer_size_int; i++)
            {
                if (buffer[i] != static_cast<int>(i))
                {
                    size_t ibuf = i / buffer_size_int;
                    size_t pos = i % buffer_size_int;

                    LOG1 << "Error on disk " << ibuf << " position " << std::hex << std::setw(8) << offset + pos * sizeof(int)
                         << "  got: " << std::hex << std::setw(8) << buffer[i] << " wanted: " << std::hex << std::setw(8) << static_cast<int>(i)
                         << std::dec;

                    i = (ibuf + 1) * buffer_size_int; // jump to next
                }
            }
        }
#else
        LOG1 << ss.str();
#endif

        offset += current_block_size;
    }

#ifdef WATCH_TIMES
    delete[] r_finish_times;
    delete[] w_finish_times;
#endif
    delete[] reqs;
    for (i = 0; i < ndisks; i++)
        delete disks[i];
    delete[] disks;
    foxxll::aligned_dealloc<BLOCK_ALIGN>(buffer);

    return 0;
}